

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void pulse_prog_arangird_patrol(CHAR_DATA *mob)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *ch;
  long in_RDI;
  int dir_next;
  OBJ_DATA *robes;
  CHAR_DATA *vch;
  char *in_stack_00001228;
  CHAR_DATA *in_stack_00001230;
  char *in_stack_00002488;
  CHAR_DATA *in_stack_00002490;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  CHAR_DATA *ch_00;
  
  uVar3 = 0xffffffff;
  if (((*(long *)(in_RDI + 0x20) == 0) && (*(long *)(in_RDI + 0xa8) != 0)) &&
     (iVar2 = number_percent(), 0x45 < iVar2)) {
    ch = (CHAR_DATA *)(ulong)((int)*(short *)(*(long *)(in_RDI + 0xa8) + 0x13a) - 0x5557);
    switch(ch) {
    case (CHAR_DATA *)0x0:
      do_south((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 3;
      break;
    case (CHAR_DATA *)0x1:
      do_west((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 3;
      break;
    case (CHAR_DATA *)0x2:
      do_west((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 3;
      break;
    case (CHAR_DATA *)0x3:
      do_west((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 0;
      break;
    case (CHAR_DATA *)0x4:
      do_north((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 3;
      break;
    case (CHAR_DATA *)0x5:
      do_west((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 0;
      break;
    case (CHAR_DATA *)0x6:
      do_north((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 0;
      break;
    case (CHAR_DATA *)0x7:
      do_north((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 1;
      break;
    case (CHAR_DATA *)0x8:
      do_east((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 2;
      break;
    case (CHAR_DATA *)0x9:
      do_south((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 1;
      break;
    case (CHAR_DATA *)0xa:
      do_east((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 1;
      break;
    case (CHAR_DATA *)0xb:
      do_east((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 1;
      break;
    case (CHAR_DATA *)0xc:
      do_east((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 2;
      break;
    case (CHAR_DATA *)0xd:
      do_south((CHAR_DATA *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),(char *)ch);
      iVar2 = 2;
      break;
    default:
      goto switchD_00683fbe_default;
    }
    for (ch_00 = *(CHAR_DATA **)(*(long *)(in_RDI + 0xa8) + 0x18); ch_00 != (CHAR_DATA *)0x0;
        ch_00 = ch_00->next_in_room) {
      bVar1 = is_npc(ch);
      if (((!bVar1) && (bVar1 = is_immortal(ch), !bVar1)) &&
         ((in_stack_ffffffffffffffe8 = (CHAR_DATA *)get_eq_char(ch_00,0xc),
          in_stack_ffffffffffffffe8 == (CHAR_DATA *)0x0 ||
          (((OBJ_INDEX_DATA *)in_stack_ffffffffffffffe8->last_fight_name)->vnum != 0x5528)))) {
        do_yell(in_stack_00001230,in_stack_00001228);
        do_murder(in_stack_00002490,in_stack_00002488);
        return;
      }
    }
    if (*(long *)(**(long **)(*(long *)(in_RDI + 0xa8) + 0x38 + (long)iVar2 * 8) + 0x18) != 0) {
      act((char *)0x0,in_stack_ffffffffffffffe8,(void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),ch
          ,0);
    }
  }
switchD_00683fbe_default:
  return;
}

Assistant:

void pulse_prog_arangird_patrol(CHAR_DATA *mob)
{
	CHAR_DATA *vch;
	OBJ_DATA *robes;
	int dir_next = -1;

	if (mob->fighting)
		return;

	if (!mob->in_room)
		return;

	if (number_percent() < 70)
		return;

	switch (mob->in_room->vnum)
	{
		case 21847:
			do_south(mob, "");
			dir_next = Directions::West;
			break;
		case 21848:
			do_west(mob, "");
			dir_next = Directions::West;
			break;
		case 21849:
			do_west(mob, "");
			dir_next = Directions::West;
			break;
		case 21850:
			do_west(mob, "");
			dir_next = Directions::North;
			break;
		case 21851:
			do_north(mob, "");
			dir_next = Directions::West;
			break;
		case 21852:
			do_west(mob, "");
			dir_next = Directions::North;
			break;
		case 21853:
			do_north(mob, "");
			dir_next = Directions::North;
			break;
		case 21854:
			do_north(mob, "");
			dir_next = Directions::East;
			break;
		case 21855:
			do_east(mob, "");
			dir_next = Directions::South;
			break;
		case 21856:
			do_south(mob, "");
			dir_next = Directions::East;
			break;
		case 21857:
			do_east(mob, "");
			dir_next = Directions::East;
			break;
		case 21858:
			do_east(mob, "");
			dir_next = Directions::East;
			break;
		case 21859:
			do_east(mob, "");
			dir_next = Directions::South;
			break;
		case 21860:
			do_south(mob, "");
			dir_next = Directions::South;
			break;
		default:
			return;
	}

	for (vch = mob->in_room->people; vch; vch = vch->next_in_room)
	{
		if (is_npc(vch))
			continue;

		if (is_immortal(vch))
			continue;

		if ((robes = get_eq_char(vch, WEAR_ABOUT)) != nullptr && robes->pIndexData->vnum == 21800)
			continue;

		do_yell(mob, "Intruder!  Sound the alarm!");
		do_murder(mob, vch->name);
		return;
	}

	if (mob->in_room->exit[dir_next]->u1.to_room->people)
	{
		act("You hear the heavy footsteps of an approaching patrol echo through the caves.",
			mob->in_room->exit[dir_next]->u1.to_room->people, 0, 0, TO_ALL);
	}
}